

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

bool cmQtAutoGenerator::FileRead(string *content,string *filename,string *error)

{
  pointer pcVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 in_R9;
  ifstream ifs;
  long local_228 [4];
  byte abStack_208 [200];
  undefined8 auStack_140 [36];
  
  content->_M_string_length = 0;
  *(content->_M_dataplus)._M_p = '\0';
  bVar2 = cmsys::SystemTools::FileExists(filename,true);
  if (!bVar2) {
    if (error != (string *)0x0) {
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x51d890);
      return false;
    }
    return false;
  }
  cmsys::SystemTools::FileLength(filename);
  std::ifstream::ifstream(local_228,(filename->_M_dataplus)._M_p,_S_in|_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::__cxx11::string::reserve((ulong)content);
    pcVar1 = (content->_M_dataplus)._M_p;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)content,pcVar1,pcVar1 + content->_M_string_length,
               *(undefined8 *)((long)auStack_140 + *(long *)(local_228[0] + -0x18)),0xffffffff,in_R9
               ,0,0xffffffff);
    if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
      bVar2 = true;
      goto LAB_0019889d;
    }
    content->_M_string_length = 0;
    *(content->_M_dataplus)._M_p = '\0';
    if (error == (string *)0x0) goto LAB_00198895;
    pcVar3 = "Reading from the file failed.";
  }
  else {
    if (error == (string *)0x0) {
LAB_00198895:
      bVar2 = false;
      goto LAB_0019889d;
    }
    pcVar3 = "Opening the file for reading failed.";
  }
  bVar2 = false;
  std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,(ulong)pcVar3);
LAB_0019889d:
  std::ifstream::~ifstream(local_228);
  return bVar2;
}

Assistant:

bool cmQtAutoGenerator::FileRead(std::string& content,
                                 std::string const& filename,
                                 std::string* error)
{
  content.clear();
  if (!cmSystemTools::FileExists(filename, true)) {
    if (error != nullptr) {
      *error = "Not a file.";
    }
    return false;
  }

  unsigned long const length = cmSystemTools::FileLength(filename);
  cmsys::ifstream ifs(filename.c_str(), (std::ios::in | std::ios::binary));

  // Use lambda to save destructor calls of ifs
  return [&ifs, length, &content, error]() -> bool {
    if (!ifs) {
      if (error != nullptr) {
        *error = "Opening the file for reading failed.";
      }
      return false;
    }
    content.reserve(length);
    typedef std::istreambuf_iterator<char> IsIt;
    content.assign(IsIt{ ifs }, IsIt{});
    if (!ifs) {
      content.clear();
      if (error != nullptr) {
        *error = "Reading from the file failed.";
      }
      return false;
    }
    return true;
  }();
}